

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_pasv_resp(Curl_easy *data,int ftpcode)

{
  curl_strdup_callback p_Var1;
  _Bool _Var2;
  CURLcode CVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_b8;
  char *host_name;
  uint ip [6];
  unsigned_long num;
  char *endp;
  char *pcStack_60;
  char sep;
  char *ptr;
  char *str;
  pingpong *pp;
  unsigned_short connectport;
  Curl_dns_entry *pCStack_40;
  resolve_t rc;
  Curl_dns_entry *addr;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *conn;
  Curl_easy *pCStack_18;
  int ftpcode_local;
  Curl_easy *data_local;
  
  ftpc = (ftp_conn *)data->conn;
  str = (char *)&((connectdata *)ftpc)->proto;
  pCStack_40 = (Curl_dns_entry *)0x0;
  paStack_30 = (anon_union_280_10_9f9d5394_for_proto *)str;
  conn._4_4_ = ftpcode;
  pCStack_18 = data;
  pcVar4 = Curl_dyn_ptr(&(((connectdata *)ftpc)->proto).ftpc.pp.recvbuf);
  ptr = pcVar4 + 4;
  (*Curl_cfree)((paStack_30->ftpc).newhost);
  (paStack_30->ftpc).newhost = (char *)0x0;
  if (((paStack_30->ftpc).count1 == 0) && (conn._4_4_ == 0xe5)) {
    pcVar4 = strchr(ptr,0x28);
    pcStack_60 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcStack_60 = pcVar4 + 1;
      endp._7_1_ = *pcStack_60;
      if ((((pcVar4[2] == endp._7_1_) && (pcVar4[3] == endp._7_1_)) && ('/' < pcVar4[4])) &&
         (pcVar4[4] < ':')) {
        uVar5 = strtoul(pcVar4 + 4,(char **)&num,10);
        if (*(char *)num == endp._7_1_) {
          if (0xffff < uVar5) {
            Curl_failf(pCStack_18,"Illegal port number in EPSV reply");
            return CURLE_FTP_WEIRD_PASV_REPLY;
          }
        }
        else {
          pcStack_60 = (char *)0x0;
        }
        if (pcStack_60 != (char *)0x0) {
          (paStack_30->ftpc).newport = (unsigned_short)uVar5;
          p_Var1 = Curl_cstrdup;
          pcVar4 = control_address((connectdata *)ftpc);
          pcVar4 = (*p_Var1)(pcVar4);
          (paStack_30->ftpc).newhost = pcVar4;
          if ((paStack_30->ftpc).newhost == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        pcStack_60 = (char *)0x0;
      }
    }
    if (pcStack_60 == (char *)0x0) {
      Curl_failf(pCStack_18,"Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (((paStack_30->ftpc).count1 != 1) || (conn._4_4_ != 0xe3)) {
      if ((paStack_30->ftpc).count1 == 0) {
        CVar3 = ftp_epsv_disable(pCStack_18,(connectdata *)ftpc);
        return CVar3;
      }
      Curl_failf(pCStack_18,"Bad PASV/EPSV response: %03d",(ulong)conn._4_4_);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    for (; *ptr != '\0'; ptr = ptr + 1) {
      _Var2 = match_pasv_6nums(ptr,(uint *)&host_name);
      if (_Var2) break;
    }
    if (*ptr == '\0') {
      Curl_failf(pCStack_18,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x10 & 1) == 0) {
      pcVar4 = curl_maprintf("%u.%u.%u.%u",(ulong)(uint)host_name,(ulong)host_name._4_4_,
                             (ulong)ip[0],(ulong)ip[1]);
      (paStack_30->ftpc).newhost = pcVar4;
    }
    else {
      if (((pCStack_18 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
          (0 < ((pCStack_18->state).feat)->log_level)))) {
        Curl_infof(pCStack_18,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                   (ulong)(uint)host_name,(ulong)host_name._4_4_,(ulong)ip[0],(ulong)ip[1],
                   (ftpc->pp).recvbuf.leng);
      }
      p_Var1 = Curl_cstrdup;
      pcVar4 = control_address((connectdata *)ftpc);
      pcVar4 = (*p_Var1)(pcVar4);
      (paStack_30->ftpc).newhost = pcVar4;
    }
    if ((paStack_30->ftpc).newhost == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (paStack_30->ftpc).newport = (short)(ip[2] << 8) + (short)ip[3];
  }
  if ((ftpc[3].pp.recvbuf.allc >> 4 & 1) == 0) {
    if ((((ftpc[3].pp.recvbuf.allc >> 0x17 & 1) != 0) && ((ftpc[3].pp.recvbuf.allc >> 6 & 1) == 0))
       && (*(paStack_30->ftpc).newhost == '\0')) {
      (*Curl_cfree)((paStack_30->ftpc).newhost);
      (paStack_30->ftpc).newhost = (char *)0x0;
      p_Var1 = Curl_cstrdup;
      pcVar4 = control_address((connectdata *)ftpc);
      pcVar4 = (*p_Var1)(pcVar4);
      (paStack_30->ftpc).newhost = pcVar4;
      if ((paStack_30->ftpc).newhost == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pp._4_4_ = Curl_resolv(pCStack_18,(paStack_30->ftpc).newhost,(uint)(paStack_30->ftpc).newport,
                           false,&stack0xffffffffffffffc0);
    if (pp._4_4_ == CURLRESOLV_PENDING) {
      Curl_resolver_wait_resolv(pCStack_18,&stack0xffffffffffffffc0);
    }
    pp._2_2_ = (paStack_30->ftpc).newport;
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf(pCStack_18,"cannot resolve new host %s:%hu",(paStack_30->ftpc).newhost,
                 (ulong)pp._2_2_);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    if ((ftpc[3].pp.recvbuf.allc >> 1 & 1) == 0) {
      local_b8 = (char *)ftpc->known_filesize;
    }
    else {
      local_b8 = ftpc->file;
    }
    pp._4_4_ = Curl_resolv(pCStack_18,local_b8,*(int *)((long)&ftpc[1].pp.sendbuf.toobig + 4),false,
                           &stack0xffffffffffffffc0);
    if (pp._4_4_ == CURLRESOLV_PENDING) {
      Curl_resolver_wait_resolv(pCStack_18,&stack0xffffffffffffffc0);
    }
    pp._2_2_ = (ushort)*(undefined4 *)((long)&ftpc[1].pp.sendbuf.toobig + 4);
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf(pCStack_18,"cannot resolve proxy host %s:%hu",local_b8,(ulong)pp._2_2_);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  addr._4_4_ = Curl_conn_setup(pCStack_18,(connectdata *)ftpc,1,pCStack_40,
                               (uint)((ftpc[3].pp.recvbuf.allc >> 0x11 & 1) != 0));
  if (addr._4_4_ == CURLE_OK) {
    if ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0x1c & 1) != 0) {
      ftp_pasv_verbose(pCStack_18,pCStack_40->addr,(paStack_30->ftpc).newhost,(uint)pp._2_2_);
    }
    Curl_resolv_unlink(pCStack_18,&stack0xffffffffffffffc0);
    (*Curl_cfree)((void *)(ftpc->pp).overflow);
    (ftpc->pp).overflow = 0;
    *(unsigned_short *)((long)&ftpc[5].pp.nread_resp + 6) = (paStack_30->ftpc).newport;
    pcVar4 = (*Curl_cstrdup)((paStack_30->ftpc).newhost);
    (ftpc->pp).overflow = (size_t)pcVar4;
    if ((ftpc->pp).overflow == 0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      ftpc[3].pp.recvbuf.allc = ftpc[3].pp.recvbuf.allc & 0xffffffffffffefff | 0x1000;
      _ftp_state(pCStack_18,'\0');
      data_local._4_4_ = addr._4_4_;
    }
  }
  else {
    Curl_resolv_unlink(pCStack_18,&stack0xffffffffffffffc0);
    if (((paStack_30->ftpc).count1 == 0) && (conn._4_4_ == 0xe5)) {
      data_local._4_4_ = ftp_epsv_disable(pCStack_18,(connectdata *)ftpc);
    }
    else {
      data_local._4_4_ = addr._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_dns_entry *addr = NULL;
  enum resolve_t rc;
  unsigned short connectport; /* the local port connect() should use! */
  struct pingpong *pp = &ftpc->pp;
  char *str =
    Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      char sep;
      ptr++;
      /* |||12345| */
      sep = ptr[0];
      /* the ISDIGIT() check here is because strtoul() accepts leading minus
         etc */
      if((ptr[1] == sep) && (ptr[2] == sep) && ISDIGIT(ptr[3])) {
        char *endp;
        unsigned long num = strtoul(&ptr[3], &endp, 10);
        if(*endp != sep)
          ptr = NULL;
        else if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[6];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(match_pasv_6nums(str, ip))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, reuse %s instead",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((ip[4] << 8) + ip[5]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(data, conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We do not want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(data, host_name, conn->primary.remote_port, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(data, &addr);

    /* we connect to the proxy's port */
    connectport = (unsigned short)conn->primary.remote_port;

    if(!addr) {
      failf(data, "cannot resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else
#endif
  {
    /* normal, direct, ftp connection */
    DEBUGASSERT(ftpc->newhost);

    /* postponed address resolution in case of tcp fastopen */
    if(conn->bits.tcp_fastopen && !conn->bits.reuse && !ftpc->newhost[0]) {
      Curl_safefree(ftpc->newhost);
      ftpc->newhost = strdup(control_address(conn));
      if(!ftpc->newhost)
        return CURLE_OUT_OF_MEMORY;
    }

    rc = Curl_resolv(data, ftpc->newhost, ftpc->newport, FALSE, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(data, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "cannot resolve new host %s:%hu",
            ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_conn_setup(data, conn, SECONDARYSOCKET, addr,
                           conn->bits.ftp_use_data_ssl ?
                           CURL_CF_SSL_ENABLE : CURL_CF_SSL_DISABLE);

  if(result) {
    Curl_resolv_unlink(data, &addr); /* we are done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(data, conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(data, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlink(data, &addr); /* we are done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  ftp_state(data, FTP_STOP); /* this phase is completed */

  return result;
}